

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_NewInnerStackScFunc<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  byte bVar1;
  uchar localRegisterID;
  FrameDisplay *environment;
  FunctionInfoPtrPtr infoRef;
  StackScriptFunction *stackFunction;
  ScriptFunction *value;
  
  bVar1 = playout->SlotIndex;
  environment = *(FrameDisplay **)(this + (ulong)playout->Instance * 8 + 0x160);
  localRegisterID = playout->Value;
  infoRef = ParseableFunctionInfo::GetNestedFuncReference
                      (*(ParseableFunctionInfo **)(this + 0x88),(uint)bVar1);
  stackFunction = GetStackNestedFunction(this,(uint)bVar1);
  value = StackScriptFunction::OP_NewStackScFunc
                    (environment,infoRef,&stackFunction->super_ScriptFunction);
  SetRegAllowStackVarEnableOnly<unsigned_char>(this,localRegisterID,value);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewInnerStackScFunc(const unaligned T * playout)
    {
        uint funcIndex = playout->SlotIndex;
        FrameDisplay *frameDisplay = (FrameDisplay*)GetNonVarReg(playout->Instance);
        SetRegAllowStackVarEnableOnly(playout->Value,
            StackScriptFunction::OP_NewStackScFunc(frameDisplay,
                this->m_functionBody->GetNestedFuncReference(funcIndex),
                this->GetStackNestedFunction(funcIndex)));
    }